

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

void Wlc_NtkExploreMem(Wlc_Ntk_t *p,int nFrames)

{
  Wlc_Obj_t *pObj;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint iObj;
  int *piVar4;
  Vec_Int_t *vCollect;
  int *piVar5;
  Vec_Int_t *__ptr;
  long lVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  
  vCollect = (Vec_Int_t *)malloc(0x10);
  vCollect->nCap = 1000;
  piVar5 = (int *)calloc(1,4000);
  vCollect->pArray = piVar5;
  __ptr = Wlc_NtkCollectMemory(p,1);
  Wlc_NtkCleanMarks(p);
  iVar1 = __ptr->nSize;
  lVar9 = (long)iVar1;
  if (0 < lVar9) {
    piVar5 = __ptr->pArray;
    lVar8 = 0;
    do {
      iVar2 = piVar5[lVar8];
      if (((long)iVar2 < 1) || (p->nObjsAlloc <= iVar2)) goto LAB_0033e5a3;
      *(ushort *)(p->pObjs + iVar2) = *(ushort *)(p->pObjs + iVar2) | 0x80;
      lVar8 = lVar8 + 1;
    } while (lVar9 != lVar8);
    if (0 < iVar1) {
      piVar5 = __ptr->pArray;
      lVar8 = 0;
      do {
        lVar6 = (long)piVar5[lVar8];
        if ((lVar6 < 1) || (p->nObjsAlloc <= piVar5[lVar8])) {
LAB_0033e5a3:
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        if ((undefined1  [24])((undefined1  [24])p->pObjs[lVar6] & (undefined1  [24])0x3f) ==
            (undefined1  [24])0x36) {
          pObj = p->pObjs + lVar6;
          vCollect->nSize = 0;
          Wlc_NtkExploreMem_rec(p,pObj,vCollect,nFrames);
          printf("Read port %6d : ",
                 (ulong)(uint)((int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555));
          uVar3 = vCollect->nSize;
          printf("Inputs = %6d  ",(ulong)uVar3);
          if (0 < (long)(int)uVar3) {
            piVar4 = vCollect->pArray;
            lVar6 = 0;
            do {
              iObj = piVar4[lVar6];
              pcVar7 = Wlc_ObjName(p,iObj);
              printf("%d(%s) ",(ulong)iObj,pcVar7);
              lVar6 = lVar6 + 1;
            } while ((int)uVar3 != lVar6);
          }
          putchar(10);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != lVar9);
      goto LAB_0033e55e;
    }
  }
  piVar5 = __ptr->pArray;
LAB_0033e55e:
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  free(__ptr);
  if (vCollect->pArray != (int *)0x0) {
    free(vCollect->pArray);
  }
  free(vCollect);
  Wlc_NtkCleanMarks(p);
  return;
}

Assistant:

void Wlc_NtkExploreMem( Wlc_Ntk_t * p, int nFrames )
{
    Wlc_Obj_t * pObj; int i, k, iObj;
    Vec_Int_t * vCollect = Vec_IntStart( 1000 );
    Vec_Int_t * vMemObjsClean = Wlc_NtkCollectMemory( p, 1 );
    Wlc_NtkCleanMarks( p );
    Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, i )
        pObj->Mark = 1;
    Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, i )
    {
        if ( Wlc_ObjType(pObj) != WLC_OBJ_READ )
            continue;
        Vec_IntClear( vCollect );
        Wlc_NtkExploreMem_rec( p, pObj, vCollect, nFrames );
        printf( "Read port %6d : ", Wlc_ObjId(p, pObj) );
        printf( "Inputs = %6d  ", Vec_IntSize(vCollect) );
        Vec_IntForEachEntry( vCollect, iObj, k )
            printf( "%d(%s) ", iObj, Wlc_ObjName(p, iObj) );
        printf( "\n" );
    }
    Vec_IntFree( vMemObjsClean );
    Vec_IntFree( vCollect );
    Wlc_NtkCleanMarks( p );
}